

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_State_PDU::ApplyDeadReckoning
          (Entity_State_PDU *this,KFLOAT64 totalTimeSinceDrReset)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KFLOAT64 local_18;
  KFLOAT64 totalTimeSinceDrReset_local;
  Entity_State_PDU *this_local;
  
  local_18 = totalTimeSinceDrReset;
  totalTimeSinceDrReset_local = (KFLOAT64)this;
  if (this->m_pDrCalc == (DeadReckoningCalculator *)0x0) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ApplyDeadReckoning",&local_39);
    KException::KException<char_const*>
              (this_00,&local_38,10,"You must call InitDeadReckoning() first.");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  UTILS::DeadReckoningCalculator::RunAlgorithm
            (this->m_pDrCalc,(KFLOAT32)(float)(double)totalTimeSinceDrReset,&this->m_EntityLocation,
             &this->m_EntityOrientation);
  return;
}

Assistant:

void Entity_State_PDU::ApplyDeadReckoning(KFLOAT64 totalTimeSinceDrReset) noexcept(false)
{
    if( !m_pDrCalc )throw KException( __FUNCTION__, INVALID_OPERATION, "You must call InitDeadReckoning() first." );
    m_pDrCalc->RunAlgorithm( totalTimeSinceDrReset, m_EntityLocation, m_EntityOrientation );
}